

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintDefinition(DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                    *this,ostream *os)

{
  pointer pSVar1;
  long *plVar2;
  Expr<float> *pEVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar6;
  ostream *poVar7;
  size_t ndx;
  ulong uVar8;
  long lVar9;
  string local_50 [32];
  string *psVar5;
  
  iVar4 = (*(this->
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            ).super_FuncBase._vptr_FuncBase[10])();
  psVar5 = (string *)CONCAT44(extraout_var,iVar4);
  initialize(this);
  pcVar6 = dataTypeNameOf<float>();
  poVar7 = std::operator<<(os,pcVar6);
  poVar7 = std::operator<<(poVar7," ");
  (*(this->
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])(local_50,this);
  poVar7 = std::operator<<(poVar7,local_50);
  std::operator<<(poVar7,"(");
  std::__cxx11::string::~string(local_50);
  pcVar6 = dataTypeNameOf<float>();
  poVar7 = std::operator<<(os,pcVar6);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,psVar5);
  poVar7 = std::operator<<(os,", ");
  pcVar6 = dataTypeNameOf<float>();
  poVar7 = std::operator<<(poVar7,pcVar6);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,psVar5 + 0x20);
  poVar7 = std::operator<<(os,", ");
  pcVar6 = dataTypeNameOf<float>();
  poVar7 = std::operator<<(poVar7,pcVar6);
  poVar7 = std::operator<<(poVar7," ");
  std::operator<<(poVar7,psVar5 + 0x40);
  std::operator<<(os,")\n{\n");
  lVar9 = 0;
  uVar8 = 0;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar8)
    break;
    plVar2 = *(long **)((long)&(pSVar1->
                               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).
                               m_ptr + lVar9);
    (**(code **)(*plVar2 + 0x10))(plVar2,os);
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  poVar7 = std::operator<<(os,"return ");
  pEVar3 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[2])(pEVar3,poVar7);
  std::operator<<(poVar7,";\n");
  std::operator<<(os,"}\n");
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}